

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh_tests.cpp
# Opt level: O2

void test<char_const**const&>(int argc,char ***argv)

{
  code *pcVar1;
  char extraout_AL;
  char extraout_AL_00;
  double __x;
  double __x_00;
  unsigned_long local_1a8;
  Expression_lhs<int> local_1a0;
  Result local_198;
  ResultBuilder _DOCTEST_RB;
  parser cmdl;
  
  argh::parser::parser(&cmdl,argc,*argv,1);
  _DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  _DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  _DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  _DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x28);
  _DOCTEST_RB.super_AssertData.m_at = DT_CHECK;
  _DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]argh/argh_tests.cpp";
  _DOCTEST_RB.super_AssertData.m_line = 0x1c7;
  _DOCTEST_RB.super_AssertData.m_expr = "5 == cmdl.pos_args().size()";
  _DOCTEST_RB.super_AssertData.m_failed = true;
  _DOCTEST_RB.super_AssertData.m_threw = false;
  _DOCTEST_RB.super_AssertData.m_threw_as = false;
  _DOCTEST_RB.super_AssertData.m_exception_type = "";
  _DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_1a0.lhs = 5;
  local_1a0.m_at = DT_CHECK;
  local_1a8 = (long)cmdl.pos_args_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)cmdl.pos_args_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  doctest::detail::Expression_lhs<int>::operator==(&local_198,&local_1a0,&local_1a8);
  doctest::detail::ResultBuilder::setResult(&_DOCTEST_RB,&local_198);
  doctest::String::~String(&local_198.m_decomp);
  doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
  doctest::AssertData::~AssertData(&_DOCTEST_RB.super_AssertData);
  _DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  _DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  _DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  _DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x28);
  _DOCTEST_RB.super_AssertData.m_at = DT_CHECK;
  _DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]argh/argh_tests.cpp";
  _DOCTEST_RB.super_AssertData.m_line = 0x1c8;
  _DOCTEST_RB.super_AssertData.m_expr = "2 == cmdl.flags().size()";
  _DOCTEST_RB.super_AssertData.m_failed = true;
  _DOCTEST_RB.super_AssertData.m_threw = false;
  _DOCTEST_RB.super_AssertData.m_threw_as = false;
  _DOCTEST_RB.super_AssertData.m_exception_type = "";
  _DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_1a0.lhs = 2;
  local_1a0.m_at = DT_CHECK;
  local_1a8 = cmdl.flags_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  doctest::detail::Expression_lhs<int>::operator==(&local_198,&local_1a0,&local_1a8);
  doctest::detail::ResultBuilder::setResult(&_DOCTEST_RB,&local_198);
  doctest::String::~String(&local_198.m_decomp);
  doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_00);
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
  doctest::AssertData::~AssertData(&_DOCTEST_RB.super_AssertData);
  argh::parser::~parser(&cmdl);
  return;
}

Assistant:

void test(int argc, T&& argv)
{
   auto cmdl = parser(argc, argv);
   CHECK(5 == cmdl.pos_args().size());
   CHECK(2 == cmdl.flags().size());
}